

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

prsndef * prsnew2(prscxdef *ctx,int t,prsndef *n1,prsndef *n2)

{
  prsndef *ppVar1;
  
  if (0x17 < ctx->prscxnrem) {
    ppVar1 = (prsndef *)ctx->prscxnode;
    ctx->prscxnrem = ctx->prscxnrem - 0x18;
    ctx->prscxnode = (uchar *)((long)&ppVar1->prsnv + 0x10);
    ppVar1->prsntyp = t;
    ppVar1->prsnnlf = 2;
    (ppVar1->prsnv).prsnvn[0] = n1;
    (ppVar1->prsnv).prsnvn[1] = n2;
    return ppVar1;
  }
  errsigf(ctx->prscxerr,"TADS",0x131);
}

Assistant:

prsndef *prsnew2(prscxdef *ctx, int t, prsndef *n1, prsndef *n2)
{
    prsndef *n = prsalo(ctx, 2);
    
    n->prsntyp = t;
    n->prsnnlf = 2;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    return(n);
}